

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventCount.hpp
# Opt level: O2

__pid_t __thiscall EventCount::wait(EventCount *this,void *__stat_loc)

{
  uint32_t uVar1;
  
  while (uVar1 = (uint32_t)((this->val_).super___atomic_base<unsigned_long>._M_i >> 0x20),
        uVar1 == (uint32_t)__stat_loc) {
    futexWait<std::atomic<unsigned_int>>
              ((atomic<unsigned_int> *)
               ((long)&(this->val_).super___atomic_base<unsigned_long>._M_i + 4),
               (uint32_t)__stat_loc,0xffffffff);
  }
  LOCK();
  (this->val_).super___atomic_base<unsigned_long>._M_i =
       (this->val_).super___atomic_base<unsigned_long>._M_i - 1;
  UNLOCK();
  return uVar1;
}

Assistant:

inline void EventCount::wait(Key key) noexcept {
    while ((val_.load(std::memory_order_acquire) >> kEpochShift) == key.epoch_) {

        futexWait(
                reinterpret_cast<Futex<std::atomic> *>(&val_) + kEpochOffset,
                key.epoch_);
    }
    // memory_order_relaxed would suffice for correctness, but the faster
    // #waiters gets to 0, the less likely it is that we'll do spurious wakeups
    // (and thus system calls)
//    uint64_t prev = val_.fetch_add(kSubWaiter, std::memory_order_seq_cst);
//    DCHECK_NE((prev & kWaiterMask), 0);
    val_.fetch_add(kSubWaiter, std::memory_order_seq_cst);
}